

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableGcCompactSettings(void)

{
  ImGuiContext *pIVar1;
  size_t sVar2;
  ImGuiTableSettings *settings_1;
  ImChunkStream<ImGuiTableSettings> new_chunk_stream;
  ImGuiTableSettings *settings;
  int required_memory;
  ImGuiContext *g;
  ImGuiTableSettings *in_stack_ffffffffffffff88;
  ImGuiTableSettings *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  ImGuiTableSettings *in_stack_ffffffffffffffa0;
  ImChunkStream<ImGuiTableSettings> *in_stack_ffffffffffffffa8;
  ImGuiTableSettings *local_40;
  ImGuiTableSettings *local_18;
  int local_c;
  
  pIVar1 = GImGui;
  local_c = 0;
  local_18 = ImChunkStream<ImGuiTableSettings>::begin(&GImGui->SettingsTables);
  while (local_18 != (ImGuiTableSettings *)0x0) {
    if (local_18->ID != 0) {
      sVar2 = TableSettingsCalcChunkSize((int)local_18->ColumnsCount);
      local_c = (int)sVar2 + local_c;
    }
    local_18 = ImChunkStream<ImGuiTableSettings>::next_chunk
                         (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  }
  if (local_c != (pIVar1->SettingsTables).Buf.Size) {
    ImChunkStream<ImGuiTableSettings>::ImChunkStream((ImChunkStream<ImGuiTableSettings> *)0x52777d);
    ImVector<char>::reserve
              ((ImVector<char> *)in_stack_ffffffffffffffa0,(int)(in_stack_ffffffffffffff98 >> 0x20))
    ;
    local_40 = ImChunkStream<ImGuiTableSettings>::begin(&pIVar1->SettingsTables);
    while (local_40 != (ImGuiTableSettings *)0x0) {
      if (local_40->ID != 0) {
        in_stack_ffffffffffffffa8 =
             (ImChunkStream<ImGuiTableSettings> *)
             TableSettingsCalcChunkSize((int)local_40->ColumnsCount);
        in_stack_ffffffffffffffa0 =
             ImChunkStream<ImGuiTableSettings>::alloc_chunk
                       ((ImChunkStream<ImGuiTableSettings> *)in_stack_ffffffffffffffa0,
                        in_stack_ffffffffffffff98);
        in_stack_ffffffffffffff98 = TableSettingsCalcChunkSize((int)local_40->ColumnsCount);
        memcpy(in_stack_ffffffffffffffa0,local_40,in_stack_ffffffffffffff98);
        in_stack_ffffffffffffff90 = local_40;
      }
      in_stack_ffffffffffffff88 =
           ImChunkStream<ImGuiTableSettings>::next_chunk
                     (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      local_40 = in_stack_ffffffffffffff88;
    }
    ImChunkStream<ImGuiTableSettings>::swap
              ((ImChunkStream<ImGuiTableSettings> *)in_stack_ffffffffffffff90,
               (ImChunkStream<ImGuiTableSettings> *)in_stack_ffffffffffffff88);
    ImChunkStream<ImGuiTableSettings>::~ImChunkStream((ImChunkStream<ImGuiTableSettings> *)0x527888)
    ;
  }
  return;
}

Assistant:

void ImGui::TableGcCompactSettings()
{
    ImGuiContext& g = *GImGui;
    int required_memory = 0;
    for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
        if (settings->ID != 0)
            required_memory += (int)TableSettingsCalcChunkSize(settings->ColumnsCount);
    if (required_memory == g.SettingsTables.Buf.Size)
        return;
    ImChunkStream<ImGuiTableSettings> new_chunk_stream;
    new_chunk_stream.Buf.reserve(required_memory);
    for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
        if (settings->ID != 0)
            memcpy(new_chunk_stream.alloc_chunk(TableSettingsCalcChunkSize(settings->ColumnsCount)), settings, TableSettingsCalcChunkSize(settings->ColumnsCount));
    g.SettingsTables.swap(new_chunk_stream);
}